

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O3

bool __thiscall ON_OBSOLETE_V5_DimExtra::CopyFrom(ON_OBSOLETE_V5_DimExtra *this,ON_Object *src)

{
  bool bVar1;
  long lVar2;
  ON_UserData **ppOVar3;
  ON_UUID *pOVar4;
  byte bVar5;
  
  bVar5 = 0;
  if (src != (ON_Object *)0x0) {
    bVar1 = ON_Object::IsKindOf(src,&m_ON_OBSOLETE_V5_DimExtra_class_rtti);
    if (bVar1) {
      ON_UserData::operator=(&this->super_ON_UserData,(ON_UserData *)src);
      ppOVar3 = &src[0xc].m_userdata_list;
      pOVar4 = &this->m_partent_uuid;
      for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
        *(ON_UserData **)pOVar4 = *ppOVar3;
        ppOVar3 = ppOVar3 + (ulong)bVar5 * -2 + 1;
        pOVar4 = (ON_UUID *)pOVar4[-(ulong)bVar5].Data4;
      }
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    return bVar1;
  }
  return false;
}

Assistant:

ON_OBSOLETE_V5_DimExtra::ON_OBSOLETE_V5_DimExtra()
{
  m_userdata_uuid = ON_CLASS_ID(ON_OBSOLETE_V5_DimExtra);
  m_application_uuid = ON_opennurbs5_id; // opennurbs.dll reads/writes this userdata
                                         // The id must be the version 5 id because
                                         // V6 SaveAs V5 needs to work, but SaveAs
                                         // V4 should not write this userdata.
  m_userdata_copycount = 1;
  SetDefaults();
}